

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_histogram_converter_impl.h
# Opt level: O0

void __thiscall
label_histogram_converter::Converter<label::StringLabel>::create_label_histrogram
          (Converter<label::StringLabel> *this,Node<label::StringLabel> *tree_node,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *label_histogram,int *tree_size)

{
  int iVar1;
  bool bVar2;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *this_00;
  reference tree_node_00;
  ConstReference pSVar3;
  string *psVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Node_iterator_base<std::pair<const_label::StringLabel,_int>,_true> local_b0;
  _Node_iterator_base<std::pair<const_label::StringLabel,_int>,_true> local_a8;
  _Node_iterator_base<std::pair<const_label::StringLabel,_int>,_true> local_a0;
  const_iterator label_in_map;
  string local_88 [8];
  string label_str;
  StringLabel key;
  Node<label::StringLabel> *child;
  const_iterator __end0;
  const_iterator __begin0;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *__range2
  ;
  int *tree_size_local;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *label_histogram_local;
  Node<label::StringLabel> *tree_node_local;
  Converter<label::StringLabel> *this_local;
  
  this_00 = node::Node<label::StringLabel>::get_children(tree_node);
  __end0 = std::
           vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ::begin(this_00);
  child = (Node<label::StringLabel> *)
          std::
          vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
          end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
                                     *)&child), bVar2) {
    tree_node_00 = __gnu_cxx::
                   __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
                   ::operator*(&__end0);
    create_label_histrogram(this,tree_node_00,label_histogram,tree_size);
    __gnu_cxx::
    __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
    ::operator++(&__end0);
  }
  pSVar3 = node::Node<label::StringLabel>::label(tree_node);
  label::StringLabel::StringLabel((StringLabel *)((long)&label_str.field_2 + 8),pSVar3);
  pSVar3 = node::Node<label::StringLabel>::label(tree_node);
  psVar4 = label::StringLabel::to_string_abi_cxx11_(pSVar3);
  std::__cxx11::string::string(local_88,(string *)psVar4);
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<label::StringLabel,_int,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::equal_to<label::StringLabel>,_std::allocator<std::pair<const_label::StringLabel,_int>_>_>
       ::find(&this->label_id_map_,(key_type *)((long)&label_str.field_2 + 8));
  std::__detail::_Node_const_iterator<std::pair<const_label::StringLabel,_int>,_false,_true>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_label::StringLabel,_int>,_false,_true> *)
             &local_a0,
             (_Node_iterator<std::pair<const_label::StringLabel,_int>,_false,_true> *)&local_a8);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<label::StringLabel,_int,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::equal_to<label::StringLabel>,_std::allocator<std::pair<const_label::StringLabel,_int>_>_>
       ::end(&this->label_id_map_);
  bVar2 = std::__detail::operator==(&local_a0,&local_b0);
  if (bVar2) {
    iVar1 = this->label_id_;
    this->label_id_ = iVar1 + 1;
    pmVar5 = std::
             unordered_map<label::StringLabel,_int,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::equal_to<label::StringLabel>,_std::allocator<std::pair<const_label::StringLabel,_int>_>_>
             ::operator[](&this->label_id_map_,(key_type *)((long)&label_str.field_2 + 8));
    *pmVar5 = iVar1;
  }
  pmVar5 = std::
           unordered_map<label::StringLabel,_int,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::equal_to<label::StringLabel>,_std::allocator<std::pair<const_label::StringLabel,_int>_>_>
           ::operator[](&this->label_id_map_,(key_type *)((long)&label_str.field_2 + 8));
  pmVar6 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[](label_histogram,pmVar5);
  *pmVar6 = *pmVar6 + 1;
  *tree_size = *tree_size + 1;
  std::__cxx11::string::~string(local_88);
  label::StringLabel::~StringLabel((StringLabel *)((long)&label_str.field_2 + 8));
  return;
}

Assistant:

void Converter<Label>::create_label_histrogram(
    const node::Node<Label>& tree_node, 
    std::unordered_map<int, int>& label_histogram, 
    int& tree_size) {

  // do recursively for all children
  for (const auto& child: tree_node.get_children()) {
    create_label_histrogram(child, label_histogram, tree_size);
  }

  Label key = tree_node.label();
  std::string label_str = tree_node.label().to_string();

  // lookup key in token_map
  typename std::unordered_map<Label, int, labelhash>::const_iterator 
                              label_in_map = label_id_map_.find(key);
  // if label not in map
  if(label_in_map == label_id_map_.end())
    // add label id to map
    label_id_map_[key] = label_id_++;

  // increase label count for current node
  ++label_histogram[label_id_map_[key]];
  // increase tree size
  ++tree_size;
}